

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

void __thiscall miniros::Subscription::~Subscription(Subscription *this)

{
  StatisticsLogger *in_RDI;
  vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
  *unaff_retaddr;
  
  *(undefined ***)in_RDI = &PTR__Subscription_0061fb10;
  std::
  set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  ::clear((set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
           *)0x4cf70d);
  std::
  vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ::clear((vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
           *)0x4cf71e);
  std::
  vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
  ::~vector(unaff_retaddr);
  std::
  map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
  ::~map((map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
          *)0x4cf740);
  StatisticsLogger::~StatisticsLogger(in_RDI);
  TransportHints::~TransportHints((TransportHints *)in_RDI);
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::~vector((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
             *)unaff_retaddr);
  std::
  set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  ::~set((set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
          *)0x4cf784);
  std::
  vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ::~vector((vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
             *)unaff_retaddr);
  std::__cxx11::string::~string((string *)&in_RDI[1].pub_);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  std::__cxx11::string::~string((string *)&in_RDI->pub_frequency_);
  std::enable_shared_from_this<miniros::Subscription>::~enable_shared_from_this
            ((enable_shared_from_this<miniros::Subscription> *)0x4cf7d0);
  return;
}

Assistant:

Subscription::~Subscription()
{
  pending_connections_.clear();
  callbacks_.clear();
}